

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerSPH.h
# Opt level: O2

void __thiscall
chrono::ChProximitySPH::Reset(ChProximitySPH *this,ChCollisionModel *mmodA,ChCollisionModel *mmodB)

{
  uint __line;
  char *__assertion;
  
  if (mmodA == (ChCollisionModel *)0x0) {
    __assertion = "mmodA";
    __line = 0x2a;
  }
  else {
    if (mmodB != (ChCollisionModel *)0x0) {
      this->modA = mmodA;
      this->modB = mmodB;
      return;
    }
    __assertion = "mmodB";
    __line = 0x2b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChProximityContainerSPH.h"
                ,__line,
                "virtual void chrono::ChProximitySPH::Reset(collision::ChCollisionModel *, collision::ChCollisionModel *)"
               );
}

Assistant:

virtual void Reset(collision::ChCollisionModel* mmodA,  ///< model A
                       collision::ChCollisionModel* mmodB   ///< model B
                       ) {
        assert(mmodA);
        assert(mmodB);

        modA = mmodA;
        modB = mmodB;
    }